

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadDeferredStubs
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,uint nestedCount,
          Type *deferredStubs,bool recurse)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  undefined4 uVar4;
  Type TVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  ByteCodeCache *buffer;
  Recycler *pRVar9;
  DeferredFunctionStub *ptr;
  DeferredFunctionStub **ppDVar10;
  int *ptr_00;
  int **ppiVar11;
  uint local_cc;
  uint j;
  TrackAllocData local_b8;
  RestorePoint *local_90;
  RestorePoint *restorePoint;
  DeferredFunctionStub *nestedStub;
  code *pcStack_78;
  uint i;
  undefined8 local_70;
  TrackAllocData local_68;
  byte local_39;
  WriteBarrierPtr *pWStack_38;
  bool recurse_local;
  Type *deferredStubs_local;
  ByteCodeCache *pBStack_28;
  uint nestedCount_local;
  ByteCodeCache *cache_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  this_local = (ByteCodeBufferReader *)current;
  if (nestedCount != 0) {
    local_39 = recurse;
    pWStack_38 = (WriteBarrierPtr *)deferredStubs;
    deferredStubs_local._4_4_ = nestedCount;
    pBStack_28 = cache;
    cache_local = (ByteCodeCache *)current;
    current_local = (byte *)this;
    pRVar9 = ScriptContext::GetRecycler(this->scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&DeferredFunctionStub::typeinfo,0,
               (ulong)deferredStubs_local._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x11cd);
    pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_68);
    pcStack_78 = Memory::Recycler::Alloc;
    local_70 = 0;
    ptr = Memory::AllocateArray<Memory::Recycler,DeferredFunctionStub,false>
                    ((Memory *)pRVar9,(Recycler *)Memory::Recycler::Alloc,0,
                     (ulong)deferredStubs_local._4_4_);
    Memory::WriteBarrierPtr<DeferredFunctionStub>::operator=
              ((WriteBarrierPtr<DeferredFunctionStub> *)pWStack_38,ptr);
    for (nestedStub._4_4_ = 0; nestedStub._4_4_ < deferredStubs_local._4_4_;
        nestedStub._4_4_ = nestedStub._4_4_ + 1) {
      ppDVar10 = Memory::WriteBarrierPtr::operator_cast_to_DeferredFunctionStub__(pWStack_38);
      restorePoint = &(*ppDVar10)[nestedStub._4_4_].restorePoint;
      Memory::WriteBarrierPtr<Js::ByteCodeCache>::operator=
                (&((DeferredFunctionStub *)restorePoint)->byteCodeCache,pBStack_28);
      cache_local = (ByteCodeCache *)
                    ReadUInt32(this,(byte *)cache_local,(uint *)&restorePoint[1].m_cMinTokMultiUnits
                              );
      cache_local = (ByteCodeCache *)
                    ReadUInt32(this,(byte *)cache_local,&restorePoint[1].m_ichMinTok);
      cache_local = (ByteCodeCache *)ReadStruct<RestorePoint>(this,(byte *)cache_local,&local_90);
      restorePoint->m_cMultiUnits = local_90->m_cMultiUnits;
      TVar7 = local_90->m_ichMinTok;
      TVar8 = local_90->m_ichMinLine;
      TVar1 = local_90->m_cMinTokMultiUnits;
      TVar2 = local_90->m_cMinLineMultiUnits;
      TVar5 = local_90->m_line;
      TVar6 = local_90->functionIdIncrement;
      TVar3 = local_90->m_fHadEol;
      uVar4 = *(undefined4 *)&local_90->field_0x2c;
      restorePoint->lengthDecr = local_90->lengthDecr;
      restorePoint->m_fHadEol = TVar3;
      *(undefined4 *)&restorePoint->field_0x2c = uVar4;
      restorePoint->m_cMinLineMultiUnits = TVar2;
      restorePoint->m_line = TVar5;
      restorePoint->functionIdIncrement = TVar6;
      restorePoint->m_ichMinTok = TVar7;
      restorePoint->m_ichMinLine = TVar8;
      restorePoint->m_cMinTokMultiUnits = TVar1;
      cache_local = (ByteCodeCache *)
                    ReadUInt32(this,(byte *)cache_local,
                               (uint *)((long)&restorePoint[1].m_cMinTokMultiUnits + 4));
      pRVar9 = ScriptContext::GetRecycler(this->scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b8,(type_info *)&int::typeinfo,0,
                 (ulong)*(uint *)((long)&restorePoint[1].m_cMinTokMultiUnits + 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                 ,0x11dd);
      pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_b8);
      ptr_00 = Memory::AllocateArray<Memory::Recycler,int,false>
                         ((Memory *)pRVar9,(Recycler *)Memory::Recycler::Alloc,0,
                          (ulong)*(uint *)((long)&restorePoint[1].m_cMinTokMultiUnits + 4));
      Memory::WriteBarrierPtr<int>::operator=
                ((WriteBarrierPtr<int> *)&restorePoint[1].m_cMinLineMultiUnits,ptr_00);
      for (local_cc = 0; buffer = cache_local,
          local_cc < *(uint *)((long)&restorePoint[1].m_cMinTokMultiUnits + 4);
          local_cc = local_cc + 1) {
        ppiVar11 = Memory::WriteBarrierPtr::operator_cast_to_int__
                             ((WriteBarrierPtr *)&restorePoint[1].m_cMinLineMultiUnits);
        cache_local = (ByteCodeCache *)ReadInt32(this,(byte *)buffer,*ppiVar11 + local_cc);
      }
      cache_local = (ByteCodeCache *)
                    ReadUInt32(this,(byte *)cache_local,&restorePoint[1].m_ichMinLine);
      if ((local_39 & 1) != 0) {
        cache_local = (ByteCodeCache *)
                      ReadDeferredStubs(this,(byte *)cache_local,pBStack_28,
                                        restorePoint[1].m_ichMinLine,
                                        (Type *)&restorePoint[1].lengthDecr,(bool)(local_39 & 1));
      }
    }
    this_local = (ByteCodeBufferReader *)cache_local;
  }
  return (byte *)this_local;
}

Assistant:

const byte* ReadDeferredStubs(const byte* current, ByteCodeCache* cache, uint nestedCount, Field(DeferredFunctionStub*)* deferredStubs, bool recurse)
    {
        if (nestedCount == 0)
        {
            return current;
        }

        *deferredStubs = RecyclerNewArray(this->scriptContext->GetRecycler(), DeferredFunctionStub, nestedCount);

        for (uint i = 0; i < nestedCount; i++)
        {
            DeferredFunctionStub* nestedStub = *deferredStubs + i;

            nestedStub->byteCodeCache = cache;

            current = ReadUInt32(current, &nestedStub->ichMin);
            current = ReadUInt32(current, (uint*)&nestedStub->fncFlags);

            serialization_alignment RestorePoint* restorePoint;
            current = ReadStruct<RestorePoint>(current, &restorePoint);
            nestedStub->restorePoint = *restorePoint;

            current = ReadUInt32(current, &nestedStub->capturedNameCount);
            nestedStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, nestedStub->capturedNameCount);
            for (uint j = 0; j < nestedStub->capturedNameCount; j++)
            {
                current = ReadInt32(current, &nestedStub->capturedNameSerializedIds[j]);
            }

            current = ReadUInt32(current, &nestedStub->nestedCount);

            if (recurse)
            {
                current = ReadDeferredStubs(current, cache, nestedStub->nestedCount, &nestedStub->deferredStubs, recurse);
            }
        }

        return current;
    }